

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::LayerNorm_x86::forward_inplace(LayerNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long in_RDI;
  float *ptr_3;
  int q_1;
  float *ptr_2;
  int i_1;
  int q;
  float *ptr_1;
  int i;
  float *ptr;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  Mat *m_1;
  Mat *m;
  int local_2a0;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  float in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 uVar5;
  float *in_stack_fffffffffffffda0;
  float *in_stack_fffffffffffffda8;
  int local_240;
  int local_23c;
  int local_22c;
  
  iVar1 = *(int *)(in_RSI + 0x28);
  iVar2 = *(int *)(in_RSI + 0x2c);
  iVar3 = *(int *)(in_RSI + 0x30);
  iVar4 = *(int *)(in_RSI + 0x38);
  if (iVar1 == 1) {
    layernorm(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
              (float *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
              in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  }
  if (iVar1 == 2) {
    for (local_22c = 0; local_22c < iVar3; local_22c = local_22c + 1) {
      layernorm(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                (float *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    }
  }
  if (iVar1 == 3) {
    if (*(int *)(in_RDI + 0xd0) == iVar2) {
      for (local_23c = 0; local_23c < iVar4; local_23c = local_23c + 1) {
        for (local_240 = 0; local_240 < iVar3; local_240 = local_240 + 1) {
          uVar5 = *(undefined4 *)(in_RSI + 0x30);
          uVar5 = 1;
          uVar5 = *(undefined4 *)(in_RSI + 0x34);
          uVar5 = 0;
          uVar5 = 0;
          layernorm(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,(float *)0x0,
                    (float)((ulong)*(undefined8 *)(in_RSI + 0x20) >> 0x20),
                    (int)*(undefined8 *)(in_RSI + 0x20),in_stack_fffffffffffffd8c);
        }
      }
    }
    else {
      for (local_2a0 = 0; local_2a0 < iVar4; local_2a0 = local_2a0 + 1) {
        layernorm(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                  (float *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                  in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int elempack = bottom_top_blob.elempack;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;

    if (dims == 1)
    {
        // assert affine_size == w

        float* ptr = bottom_top_blob;
        layernorm(ptr, gamma_data, beta_data, eps, w * elempack, 1);
    }

    if (dims == 2)
    {
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            layernorm(ptr, gamma_data, beta_data, eps, w, elempack);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    layernorm(ptr, gamma_data, beta_data, eps, w, elempack);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                layernorm(ptr, gamma_data, beta_data, eps, w * h, elempack);
            }
        }
    }

    return 0;
}